

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

void __thiscall CCharacter::FireWeapon(CCharacter *this)

{
  CEntity *pCVar1;
  vec2 Pos;
  vec2 Pos_00;
  vec2 Pos_01;
  vec2 Pos_02;
  vec2 Pos_03;
  vec2 Pos_04;
  vec2 Pos_05;
  vec2 Pos1;
  vec2 Pos_06;
  vec2 Pos_07;
  vec2 Pos_08;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar8;
  CInputCount CVar9;
  IServer *pIVar10;
  CConfig *pCVar11;
  undefined4 extraout_var;
  CGameContext *pCVar12;
  IConsole *pIVar13;
  vec2 vVar14;
  vec2 vVar15;
  CTuningParams *pCVar16;
  long lVar17;
  CEntity *in_RDI;
  long in_FS_OFFSET;
  bool bVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float Speed;
  float v;
  float a;
  int i_1;
  int ShotSpread;
  CCharacter *pTarget;
  int i;
  int Num;
  int Hits;
  bool WillFire;
  bool FullAuto;
  vec2 Dir;
  vec2 ProjStartPos;
  vec2 Direction;
  float Spreading [5];
  CCharacter *apEnts [64];
  char aBuf [256];
  anon_union_4_2_947302a4_for_vector2_base<float>_3 in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff95c;
  anon_union_4_2_94730284_for_vector2_base<float>_1 in_stack_fffffffffffff960;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 in_stack_fffffffffffff964;
  undefined4 in_stack_fffffffffffff968;
  undefined4 uVar22;
  float in_stack_fffffffffffff96c;
  int in_stack_fffffffffffff970;
  int in_stack_fffffffffffff974;
  CGameContext *in_stack_fffffffffffff978;
  anon_union_4_2_94730284_for_vector2_base<float>_1 in_stack_fffffffffffff980;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 in_stack_fffffffffffff984;
  undefined4 in_stack_fffffffffffff988;
  undefined4 in_stack_fffffffffffff98c;
  vec2 in_stack_fffffffffffff998;
  anon_union_4_2_94730284_for_vector2_base<float>_1 in_stack_fffffffffffff9b0;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 in_stack_fffffffffffff9b4;
  undefined1 Explosive;
  vec2 in_stack_fffffffffffff9b8;
  int in_stack_fffffffffffff9c0;
  int in_stack_fffffffffffff9c4;
  CGameWorld *in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d4;
  vec2 in_stack_fffffffffffff9d8;
  anon_union_4_2_94730284_for_vector2_base<float>_1 in_stack_fffffffffffff9e0;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 in_stack_fffffffffffff9e4;
  CCharacter *in_stack_fffffffffffff9e8;
  int in_stack_fffffffffffffa08;
  int in_stack_fffffffffffffa10;
  vec2 in_stack_fffffffffffffa20;
  undefined1 in_stack_fffffffffffffa28 [16];
  int local_4b4;
  int local_480;
  int local_478;
  int local_474;
  vector2_base<float> local_420;
  vector2_base<float> local_418;
  vec2 local_410;
  vector2_base<float> local_408;
  vector2_base<float> local_400;
  vector2_base<float> local_3f8;
  vector2_base<float> local_3f0;
  vector2_base<float> local_3e8;
  vector2_base<float> local_3e0;
  vector2_base<float> local_3d8;
  vector2_base<float> local_3d0;
  vector2_base<float> local_3c8;
  vector2_base<float> local_3c0;
  vector2_base<float> local_3b8;
  vector2_base<float> local_3b0;
  vector2_base<float> local_3a8;
  vector2_base<float> local_3a0;
  vector2_base<float> local_398;
  vector2_base<float> local_390;
  vector2_base<float> local_388;
  vector2_base<float> local_380;
  vec2 local_378;
  vector2_base<float> local_370;
  vector2_base<float> local_368;
  vec2 local_360;
  vector2_base<float> local_358;
  vector2_base<float> local_350;
  vector2_base<float> local_348;
  vec2 local_340;
  vector2_base<float> local_338;
  vector2_base<float> local_330;
  undefined8 local_328;
  float afStack_320 [6];
  long local_308 [64];
  char local_108 [256];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)&in_RDI[5].m_pGameWorld == 0) {
    DoWeaponSwitch((CCharacter *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
    vector2_base<float>::vector2_base
              (&local_338,(float)*(int *)((long)&in_RDI[6].m_pPrevTypeEntity + 4),
               (float)*(int *)&in_RDI[6].m_pNextTypeEntity);
    local_330 = normalize((vector2_base<float> *)
                          CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
    bVar2 = false;
    if (((in_RDI[4].m_Pos.field_1 == (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x3) ||
        (in_RDI[4].m_Pos.field_1 == (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x2)) ||
       (in_RDI[4].m_Pos.field_1 == (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x4)) {
      bVar2 = true;
    }
    CVar9 = CountInput((int)in_stack_fffffffffffff964,(int)in_stack_fffffffffffff960);
    local_474 = CVar9.m_Presses;
    bVar18 = local_474 != 0;
    if (((bVar2) && ((in_RDI[6].m_ID & 1U) != 0)) &&
       ((&in_RDI[3].m_ProximityRadius)[(long)(int)in_RDI[4].m_Pos.field_1 * 3] != 0.0)) {
      bVar18 = true;
    }
    if (bVar18) {
      if ((&in_RDI[3].m_ProximityRadius)[(long)(int)in_RDI[4].m_Pos.field_1 * 3] == 0.0) {
        pIVar10 = CEntity::Server((CEntity *)0x118cd2);
        iVar3 = IServer::TickSpeed(pIVar10);
        *(int *)&in_RDI[5].m_pGameWorld = (iVar3 * 0x7d) / 1000;
        iVar3 = *(int *)((long)&in_RDI[5].m_pNextTypeEntity + 4);
        pIVar10 = CEntity::Server((CEntity *)0x118d05);
        iVar4 = IServer::TickSpeed(pIVar10);
        pIVar10 = CEntity::Server((CEntity *)0x118d2c);
        iVar5 = IServer::Tick(pIVar10);
        if (iVar3 + iVar4 <= iVar5) {
          CEntity::GameServer((CEntity *)0x118d4e);
          local_340 = in_RDI->m_Pos;
          Pos_01.field_1 = in_stack_fffffffffffff984;
          Pos_01.field_0 = in_stack_fffffffffffff980;
          CGameContext::CreateSound
                    (in_stack_fffffffffffff978,Pos_01,in_stack_fffffffffffff974,
                     CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
          pIVar10 = CEntity::Server((CEntity *)0x118d8c);
          iVar3 = IServer::Tick(pIVar10);
          *(int *)((long)&in_RDI[5].m_pNextTypeEntity + 4) = iVar3;
        }
      }
      else {
        CEntity::GetProximityRadius(in_RDI);
        local_358 = vector2_base<float>::operator*
                              ((vector2_base<float> *)
                               CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                               in_stack_fffffffffffff96c);
        local_350 = vector2_base<float>::operator*
                              ((vector2_base<float> *)
                               CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                               in_stack_fffffffffffff96c);
        local_348 = vector2_base<float>::operator+
                              ((vector2_base<float> *)
                               CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                               (vector2_base<float> *)
                               CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
        pCVar11 = CEntity::Config((CEntity *)0x118e24);
        if (pCVar11->m_Debug != 0) {
          uVar6 = CPlayer::GetCID((CPlayer *)in_RDI[1]._vptr_CEntity);
          pIVar10 = CEntity::Server((CEntity *)0x118e66);
          uVar7 = CPlayer::GetCID((CPlayer *)in_RDI[1]._vptr_CEntity);
          iVar3 = (*(pIVar10->super_IInterface)._vptr_IInterface[2])(pIVar10,(ulong)uVar7);
          uVar7 = CPlayer::GetTeam((CPlayer *)in_RDI[1]._vptr_CEntity);
          in_stack_fffffffffffff958 = in_RDI[4].m_Pos.field_1;
          str_format(local_108,0x100,"shot player=\'%d:%s\' team=%d weapon=%d",(ulong)uVar6,
                     CONCAT44(extraout_var,iVar3),(ulong)uVar7);
          pCVar12 = CEntity::GameServer((CEntity *)0x118ef9);
          pIVar13 = CGameContext::Console(pCVar12);
          (*(pIVar13->super_IInterface)._vptr_IInterface[0x19])(pIVar13,2,"game",local_108,0);
        }
        switch(in_RDI[4].m_Pos.field_1) {
        case (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0:
          CEntity::GameServer((CEntity *)0x118f6a);
          local_360 = in_RDI->m_Pos;
          Pos_02.field_1.y = in_stack_fffffffffffff984.y;
          Pos_02.field_0 = in_stack_fffffffffffff980;
          CGameContext::CreateSound
                    (in_stack_fffffffffffff978,Pos_02,in_stack_fffffffffffff974,
                     CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
          local_478 = 0;
          CEntity::GameWorld(in_RDI);
          local_368 = local_348;
          CEntity::GetProximityRadius(in_RDI);
          iVar3 = CGameWorld::FindEntities
                            ((CGameWorld *)
                             CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                             in_stack_fffffffffffff998,in_stack_fffffffffffff984.y,
                             (CEntity **)in_stack_fffffffffffff978,in_stack_fffffffffffff974,
                             in_stack_fffffffffffff970);
          for (local_480 = 0; local_480 < iVar3; local_480 = local_480 + 1) {
            pCVar1 = (CEntity *)local_308[local_480];
            if (pCVar1 != in_RDI) {
              pCVar12 = CEntity::GameServer((CEntity *)0x11906c);
              CGameContext::Collision(pCVar12);
              local_370 = local_348;
              local_378 = pCVar1->m_Pos;
              Pos1.field_1 = in_stack_fffffffffffff9b4;
              Pos1.field_0 = in_stack_fffffffffffff9b0;
              iVar4 = CCollision::IntersectLine
                                ((CCollision *)
                                 CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                                 in_stack_fffffffffffff9b8,Pos1,(vec2 *)in_stack_fffffffffffff978,
                                 (vec2 *)CONCAT44(in_stack_fffffffffffff974,
                                                  in_stack_fffffffffffff970));
              if (iVar4 == 0) {
                local_380 = vector2_base<float>::operator-
                                      ((vector2_base<float> *)
                                       CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970)
                                       ,(vector2_base<float> *)
                                        CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968
                                                ));
                fVar21 = length((vector2_base<float> *)0x1190f2);
                if (fVar21 <= 0.0) {
                  CEntity::GameServer((CEntity *)0x1191d7);
                  local_3a8 = local_348;
                  Pos_00.field_1 = in_stack_fffffffffffff964;
                  Pos_00.field_0 = in_stack_fffffffffffff960;
                  CGameContext::CreateHammerHit
                            ((CGameContext *)
                             CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),Pos_00);
                }
                else {
                  CEntity::GameServer((CEntity *)0x11910b);
                  local_3a0 = vector2_base<float>::operator-
                                        ((vector2_base<float> *)
                                         CONCAT44(in_stack_fffffffffffff974,
                                                  in_stack_fffffffffffff970),
                                         (vector2_base<float> *)
                                         CONCAT44(in_stack_fffffffffffff96c,
                                                  in_stack_fffffffffffff968));
                  local_398 = normalize((vector2_base<float> *)
                                        CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958
                                                ));
                  CEntity::GetProximityRadius(in_RDI);
                  local_390 = vector2_base<float>::operator*
                                        ((vector2_base<float> *)
                                         CONCAT44(in_stack_fffffffffffff974,
                                                  in_stack_fffffffffffff970),
                                         in_stack_fffffffffffff96c);
                  local_388 = vector2_base<float>::operator*
                                        ((vector2_base<float> *)
                                         CONCAT44(in_stack_fffffffffffff974,
                                                  in_stack_fffffffffffff970),
                                         in_stack_fffffffffffff96c);
                  vector2_base<float>::operator-
                            ((vector2_base<float> *)
                             CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                             (vector2_base<float> *)
                             CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
                  Pos.field_1 = in_stack_fffffffffffff964;
                  Pos.field_0 = in_stack_fffffffffffff960;
                  CGameContext::CreateHammerHit
                            ((CGameContext *)
                             CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),Pos);
                }
                vector2_base<float>::vector2_base(&local_3b0);
                local_3b8 = vector2_base<float>::operator-
                                      ((vector2_base<float> *)
                                       CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970)
                                       ,(vector2_base<float> *)
                                        CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968
                                                ));
                fVar21 = length((vector2_base<float> *)0x119238);
                if (fVar21 <= 0.0) {
                  vector2_base<float>::vector2_base(&local_3d0,0.0,-1.0);
                  local_3b0 = local_3d0;
                }
                else {
                  local_3c8 = vector2_base<float>::operator-
                                        ((vector2_base<float> *)
                                         CONCAT44(in_stack_fffffffffffff974,
                                                  in_stack_fffffffffffff970),
                                         (vector2_base<float> *)
                                         CONCAT44(in_stack_fffffffffffff96c,
                                                  in_stack_fffffffffffff968));
                  local_3c0 = normalize((vector2_base<float> *)
                                        CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958
                                                ));
                  local_3b0 = local_3c0;
                }
                vector2_base<float>::vector2_base(&local_3d8,0.0,-1.0);
                vector2_base<float>::vector2_base(&local_3f8,0.0,-1.1);
                local_3f0 = vector2_base<float>::operator+
                                      ((vector2_base<float> *)
                                       CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970)
                                       ,(vector2_base<float> *)
                                        CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968
                                                ));
                local_3e8 = normalize((vector2_base<float> *)
                                      CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958))
                ;
                local_3e0 = vector2_base<float>::operator*
                                      ((vector2_base<float> *)
                                       CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970)
                                       ,in_stack_fffffffffffff96c);
                vector2_base<float>::operator+
                          ((vector2_base<float> *)
                           CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                           (vector2_base<float> *)
                           CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
                vector2_base<float>::operator*
                          ((vector2_base<float> *)
                           CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                           in_stack_fffffffffffff96c);
                CPlayer::GetCID((CPlayer *)in_RDI[1]._vptr_CEntity);
                TakeDamage(in_stack_fffffffffffff9e8,in_stack_fffffffffffffa28._0_8_,
                           in_stack_fffffffffffffa20,(int)in_stack_fffffffffffff9e4,
                           (int)in_stack_fffffffffffff9e0,(int)in_stack_fffffffffffff9d8.field_1);
                local_478 = local_478 + 1;
              }
            }
          }
          if (local_478 != 0) {
            pIVar10 = CEntity::Server((CEntity *)0x119455);
            iVar3 = IServer::TickSpeed(pIVar10);
            *(int *)&in_RDI[5].m_pGameWorld = iVar3 / 3;
          }
          break;
        case (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x1:
          CEntity::operator_new(CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
          Explosive = in_stack_fffffffffffff9b4._3_1_;
          CEntity::GameWorld(in_RDI);
          CPlayer::GetCID((CPlayer *)in_RDI[1]._vptr_CEntity);
          local_400 = local_348;
          local_408 = local_330;
          pIVar10 = CEntity::Server((CEntity *)0x1194ea);
          IServer::TickSpeed(pIVar10);
          pCVar12 = CEntity::GameServer((CEntity *)0x11952b);
          pCVar16 = CGameContext::Tuning(pCVar12);
          CTuneParam::operator_cast_to_float(&pCVar16->m_GunLifetime);
          uVar22 = 1;
          Pos_06.field_1 = in_stack_fffffffffffff9e4;
          Pos_06.field_0 = in_stack_fffffffffffff9e0;
          CProjectile::CProjectile
                    ((CProjectile *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                     in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0,
                     Pos_06,in_stack_fffffffffffff9d8,(int)in_stack_fffffffffffff9b8.field_1,
                     (int)in_stack_fffffffffffff9b8.field_0,(bool)Explosive,
                     in_stack_fffffffffffff9b0.x,in_stack_fffffffffffffa08,in_stack_fffffffffffffa10
                    );
          CEntity::GameServer((CEntity *)0x1195f1);
          local_410 = in_RDI->m_Pos;
          Pos_03.field_1 = in_stack_fffffffffffff984;
          Pos_03.field_0 = in_stack_fffffffffffff980;
          CGameContext::CreateSound
                    (in_stack_fffffffffffff978,Pos_03,in_stack_fffffffffffff974,
                     CONCAT44(in_stack_fffffffffffff96c,uVar22));
          break;
        case (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x2:
          for (local_4b4 = -2; local_4b4 < 3; local_4b4 = local_4b4 + 1) {
            local_328 = 0xbd8f5c29be3d70a4;
            afStack_320[0] = 0.0;
            afStack_320[1] = 0.07;
            afStack_320[2] = 0.185;
            fVar20 = angle((vector2_base<float> *)0x1196a4);
            fVar21 = afStack_320[local_4b4];
            iVar3 = absolute<int>(local_4b4);
            pCVar12 = CEntity::GameServer((CEntity *)0x11971c);
            pCVar16 = CGameContext::Tuning(pCVar12);
            fVar19 = CTuneParam::operator_cast_to_float(&pCVar16->m_ShotgunSpeeddiff);
            mix<float,float>(fVar19,1.0,1.0 - (float)iVar3 / 2.0);
            CEntity::operator_new(CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
            CEntity::GameWorld(in_RDI);
            CPlayer::GetCID((CPlayer *)in_RDI[1]._vptr_CEntity);
            local_418 = local_348;
            fVar19 = cosf(fVar20 + fVar21);
            fVar21 = sinf(fVar20 + fVar21);
            vector2_base<float>::vector2_base(&local_420,fVar19,fVar21);
            vector2_base<float>::operator*
                      ((vector2_base<float> *)
                       CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                       in_stack_fffffffffffff96c);
            pIVar10 = CEntity::Server((CEntity *)0x119821);
            IServer::TickSpeed(pIVar10);
            pCVar12 = CEntity::GameServer((CEntity *)0x119862);
            pCVar16 = CGameContext::Tuning(pCVar12);
            iVar3 = (int)pCVar12;
            CTuneParam::operator_cast_to_float(&pCVar16->m_ShotgunLifetime);
            in_stack_fffffffffffff968 = 2;
            in_stack_fffffffffffff960.x = -NAN;
            Pos_07.field_1 = in_stack_fffffffffffff9e4;
            Pos_07.field_0 = in_stack_fffffffffffff9e0;
            CProjectile::CProjectile
                      ((CProjectile *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                       in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0
                       ,Pos_07,in_stack_fffffffffffff9d8,(int)in_stack_fffffffffffff9b8.field_1,
                       (int)in_stack_fffffffffffff9b8.field_0,in_stack_fffffffffffff9b4._3_1_,
                       in_stack_fffffffffffff9b0.x,in_stack_fffffffffffffa08,iVar3);
          }
          CEntity::GameServer((CEntity *)0x11996d);
          Pos_04.field_1 = in_stack_fffffffffffff984;
          Pos_04.field_0 = in_stack_fffffffffffff980;
          CGameContext::CreateSound
                    (in_stack_fffffffffffff978,Pos_04,in_stack_fffffffffffff974,
                     CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
          break;
        case (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x3:
          CEntity::operator_new(CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
          CEntity::GameWorld(in_RDI);
          aVar8 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)
                  CPlayer::GetCID((CPlayer *)in_RDI[1]._vptr_CEntity);
          vVar14 = (vec2)CEntity::Server((CEntity *)0x119a13);
          iVar3 = IServer::TickSpeed((IServer *)vVar14);
          fVar21 = (float)iVar3;
          pCVar12 = CEntity::GameServer((CEntity *)0x119a4b);
          pCVar16 = CGameContext::Tuning(pCVar12);
          fVar20 = CTuneParam::operator_cast_to_float(&pCVar16->m_GrenadeLifetime);
          uVar22 = 3;
          Pos_08.field_1 = aVar8;
          Pos_08.field_0 = in_stack_fffffffffffff9e0;
          CProjectile::CProjectile
                    ((CProjectile *)CONCAT44(iVar3,in_stack_fffffffffffff9d0),(CGameWorld *)pCVar12,
                     (int)fVar21,in_stack_fffffffffffff9c0,Pos_08,vVar14,
                     (int)((ulong)pCVar16 >> 0x20),(int)pCVar16,SUB41((uint)fVar20 >> 0x18,0),
                     in_stack_fffffffffffff9b0.x,in_stack_fffffffffffffa08,in_stack_fffffffffffffa10
                    );
          CEntity::GameServer((CEntity *)0x119aff);
          Pos_05.field_1 = in_stack_fffffffffffff984;
          Pos_05.field_0 = in_stack_fffffffffffff980;
          CGameContext::CreateSound
                    (in_stack_fffffffffffff978,Pos_05,in_stack_fffffffffffff974,
                     CONCAT44(in_stack_fffffffffffff96c,uVar22));
          break;
        case (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x4:
          vVar14 = (vec2)CEntity::operator_new
                                   (CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
          vVar15 = (vec2)CEntity::GameWorld(in_RDI);
          pCVar12 = CEntity::GameServer((CEntity *)0x119bab);
          pCVar16 = CGameContext::Tuning(pCVar12);
          fVar21 = CTuneParam::operator_cast_to_float(&pCVar16->m_LaserReach);
          iVar3 = CPlayer::GetCID((CPlayer *)in_RDI[1]._vptr_CEntity);
          CLaser::CLaser((CLaser *)pCVar16,(CGameWorld *)CONCAT44(fVar21,iVar3),vVar15,vVar14,
                         in_stack_fffffffffffff984.y,(int)in_stack_fffffffffffff980);
          CEntity::GameServer((CEntity *)0x119c2a);
          vVar15.field_1.y = in_stack_fffffffffffff984.y;
          vVar15.field_0 = in_stack_fffffffffffff980;
          CGameContext::CreateSound
                    (in_stack_fffffffffffff978,vVar15,in_stack_fffffffffffff974,
                     CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
          break;
        case (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x5:
          in_RDI[3].m_ID = 0;
          *(vector2_base<float> *)((long)&in_RDI[8]._vptr_CEntity + 4) = local_330;
          aVar8 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)
                  (g_pData->m_Weapons).m_Ninja.m_Movetime;
          pIVar10 = CEntity::Server((CEntity *)0x119cc1);
          iVar3 = IServer::TickSpeed(pIVar10);
          *(int *)&in_RDI[8].m_pPrevTypeEntity = ((int)aVar8 * iVar3) / 1000;
          fVar21 = length((vector2_base<float> *)0x119d02);
          *(int *)((long)&in_RDI[8].m_pPrevTypeEntity + 4) = (int)fVar21;
          CEntity::GameServer((CEntity *)0x119d19);
          vVar14.field_1 = aVar8;
          vVar14.field_0 = in_stack_fffffffffffff980;
          CGameContext::CreateSound
                    (in_stack_fffffffffffff978,vVar14,in_stack_fffffffffffff974,
                     CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
        }
        pIVar10 = CEntity::Server((CEntity *)0x119d57);
        iVar3 = IServer::Tick(pIVar10);
        *(int *)((long)&in_RDI[5].m_pGameWorld + 4) = iVar3;
        if (0 < (int)(&in_RDI[3].m_ProximityRadius)[(long)(int)in_RDI[4].m_Pos.field_1 * 3]) {
          lVar17 = (long)(int)in_RDI[4].m_Pos.field_1;
          (&in_RDI[3].m_ProximityRadius)[lVar17 * 3] =
               (float)((int)(&in_RDI[3].m_ProximityRadius)[lVar17 * 3] + -1);
        }
        if (*(int *)&in_RDI[5].m_pGameWorld == 0) {
          iVar3 = (g_pData->m_Weapons).m_aId[(int)in_RDI[4].m_Pos.field_1].m_Firedelay;
          pIVar10 = CEntity::Server((CEntity *)0x119df6);
          iVar4 = IServer::TickSpeed(pIVar10);
          *(int *)&in_RDI[5].m_pGameWorld = (iVar3 * iVar4) / 1000;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CCharacter::FireWeapon()
{
	if(m_ReloadTimer != 0)
		return;

	DoWeaponSwitch();
	vec2 Direction = normalize(vec2(m_LatestInput.m_TargetX, m_LatestInput.m_TargetY));

	bool FullAuto = false;
	if(m_ActiveWeapon == WEAPON_GRENADE || m_ActiveWeapon == WEAPON_SHOTGUN || m_ActiveWeapon == WEAPON_LASER)
		FullAuto = true;


	// check if we gonna fire
	bool WillFire = false;
	if(CountInput(m_LatestPrevInput.m_Fire, m_LatestInput.m_Fire).m_Presses)
		WillFire = true;

	if(FullAuto && (m_LatestInput.m_Fire&1) && m_aWeapons[m_ActiveWeapon].m_Ammo)
		WillFire = true;

	if(!WillFire)
		return;

	// check for ammo
	if(!m_aWeapons[m_ActiveWeapon].m_Ammo)
	{
		// 125ms is a magical limit of how fast a human can click
		m_ReloadTimer = 125 * Server()->TickSpeed() / 1000;
		if(m_LastNoAmmoSound+Server()->TickSpeed() <= Server()->Tick())
		{
			GameServer()->CreateSound(m_Pos, SOUND_WEAPON_NOAMMO);
			m_LastNoAmmoSound = Server()->Tick();
		}
		return;
	}

	vec2 ProjStartPos = m_Pos+Direction*GetProximityRadius()*0.75f;

	if(Config()->m_Debug)
	{
		char aBuf[256];
		str_format(aBuf, sizeof(aBuf), "shot player='%d:%s' team=%d weapon=%d", m_pPlayer->GetCID(), Server()->ClientName(m_pPlayer->GetCID()), m_pPlayer->GetTeam(), m_ActiveWeapon);
		GameServer()->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", aBuf);
	}

	switch(m_ActiveWeapon)
	{
		case WEAPON_HAMMER:
		{
			GameServer()->CreateSound(m_Pos, SOUND_HAMMER_FIRE);

			CCharacter *apEnts[MAX_CLIENTS];
			int Hits = 0;
			int Num = GameWorld()->FindEntities(ProjStartPos, GetProximityRadius()*0.5f, (CEntity**)apEnts,
														MAX_CLIENTS, CGameWorld::ENTTYPE_CHARACTER);

			for(int i = 0; i < Num; ++i)
			{
				CCharacter *pTarget = apEnts[i];

				if((pTarget == this) || GameServer()->Collision()->IntersectLine(ProjStartPos, pTarget->m_Pos, NULL, NULL))
					continue;

				// set his velocity to fast upward (for now)
				if(length(pTarget->m_Pos-ProjStartPos) > 0.0f)
					GameServer()->CreateHammerHit(pTarget->m_Pos-normalize(pTarget->m_Pos-ProjStartPos)*GetProximityRadius()*0.5f);
				else
					GameServer()->CreateHammerHit(ProjStartPos);

				vec2 Dir;
				if(length(pTarget->m_Pos - m_Pos) > 0.0f)
					Dir = normalize(pTarget->m_Pos - m_Pos);
				else
					Dir = vec2(0.f, -1.f);

				pTarget->TakeDamage(vec2(0.f, -1.f) + normalize(Dir + vec2(0.f, -1.1f)) * 10.0f, Dir*-1, g_pData->m_Weapons.m_Hammer.m_pBase->m_Damage,
					m_pPlayer->GetCID(), m_ActiveWeapon);
				Hits++;
			}

			// if we Hit anything, we have to wait for the reload
			if(Hits)
				m_ReloadTimer = Server()->TickSpeed()/3;

		} break;

		case WEAPON_GUN:
		{
			new CProjectile(GameWorld(), WEAPON_GUN,
				m_pPlayer->GetCID(),
				ProjStartPos,
				Direction,
				(int)(Server()->TickSpeed()*GameServer()->Tuning()->m_GunLifetime),
				g_pData->m_Weapons.m_Gun.m_pBase->m_Damage, false, 0, -1, WEAPON_GUN);

			GameServer()->CreateSound(m_Pos, SOUND_GUN_FIRE);
		} break;

		case WEAPON_SHOTGUN:
		{
			int ShotSpread = 2;

			for(int i = -ShotSpread; i <= ShotSpread; ++i)
			{
				float Spreading[] = {-0.185f, -0.070f, 0, 0.070f, 0.185f};
				float a = angle(Direction);
				a += Spreading[i+2];
				float v = 1-(absolute(i)/(float)ShotSpread);
				float Speed = mix((float)GameServer()->Tuning()->m_ShotgunSpeeddiff, 1.0f, v);
				new CProjectile(GameWorld(), WEAPON_SHOTGUN,
					m_pPlayer->GetCID(),
					ProjStartPos,
					vec2(cosf(a), sinf(a))*Speed,
					(int)(Server()->TickSpeed()*GameServer()->Tuning()->m_ShotgunLifetime),
					g_pData->m_Weapons.m_Shotgun.m_pBase->m_Damage, false, 0, -1, WEAPON_SHOTGUN);
			}

			GameServer()->CreateSound(m_Pos, SOUND_SHOTGUN_FIRE);
		} break;

		case WEAPON_GRENADE:
		{
			new CProjectile(GameWorld(), WEAPON_GRENADE,
				m_pPlayer->GetCID(),
				ProjStartPos,
				Direction,
				(int)(Server()->TickSpeed()*GameServer()->Tuning()->m_GrenadeLifetime),
				g_pData->m_Weapons.m_Grenade.m_pBase->m_Damage, true, 0, SOUND_GRENADE_EXPLODE, WEAPON_GRENADE);

			GameServer()->CreateSound(m_Pos, SOUND_GRENADE_FIRE);
		} break;

		case WEAPON_LASER:
		{
			new CLaser(GameWorld(), m_Pos, Direction, GameServer()->Tuning()->m_LaserReach, m_pPlayer->GetCID());
			GameServer()->CreateSound(m_Pos, SOUND_LASER_FIRE);
		} break;

		case WEAPON_NINJA:
		{
			m_NumObjectsHit = 0;

			m_Ninja.m_ActivationDir = Direction;
			m_Ninja.m_CurrentMoveTime = g_pData->m_Weapons.m_Ninja.m_Movetime * Server()->TickSpeed() / 1000;
			m_Ninja.m_OldVelAmount = length(m_Core.m_Vel);

			GameServer()->CreateSound(m_Pos, SOUND_NINJA_FIRE);
		} break;

	}

	m_AttackTick = Server()->Tick();

	if(m_aWeapons[m_ActiveWeapon].m_Ammo > 0) // -1 == unlimited
		m_aWeapons[m_ActiveWeapon].m_Ammo--;

	if(!m_ReloadTimer)
		m_ReloadTimer = g_pData->m_Weapons.m_aId[m_ActiveWeapon].m_Firedelay * Server()->TickSpeed() / 1000;
}